

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::SelectFlatLoopSwitch<float,float,duckdb::Equals,true,false>
                (float *ldata,float *rdata,SelectionVector *sel,idx_t count,ValidityMask *mask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t iVar3;
  ulong uVar4;
  float *pfVar5;
  ulong uVar6;
  sel_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar3 = SelectFlatLoop<float,float,duckdb::Equals,true,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar3;
    }
    if (count + 0x3f < 0x40) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      uVar8 = 0;
      uVar10 = 0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar6 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar6 = count;
          }
LAB_00ed4484:
          uVar4 = uVar10;
          if (uVar10 < uVar6) {
            pfVar5 = rdata + uVar10;
            do {
              uVar11 = uVar10;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar11 = (ulong)sel->sel_vector[uVar10];
              }
              bVar2 = duckdb::Equals::Operation<float>(ldata,pfVar5);
              true_sel->sel_vector[iVar3] = (sel_t)uVar11;
              iVar3 = iVar3 + bVar2;
              uVar10 = uVar10 + 1;
              pfVar5 = pfVar5 + 1;
              uVar4 = uVar6;
            } while (uVar6 != uVar10);
          }
        }
        else {
          uVar11 = puVar1[uVar8];
          uVar6 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar6 = count;
          }
          uVar4 = uVar6;
          if (uVar11 != 0) {
            if (uVar11 == 0xffffffffffffffff) goto LAB_00ed4484;
            uVar4 = uVar10;
            if (uVar10 < uVar6) {
              pfVar5 = rdata + uVar10;
              uVar9 = 0;
              do {
                if (sel->sel_vector == (sel_t *)0x0) {
                  sVar7 = (int)uVar10 + (int)uVar9;
                }
                else {
                  sVar7 = sel->sel_vector[uVar10 + uVar9];
                }
                if ((uVar11 >> (uVar9 & 0x3f) & 1) == 0) {
                  uVar4 = 0;
                }
                else {
                  bVar2 = duckdb::Equals::Operation<float>(ldata,pfVar5);
                  uVar4 = (ulong)bVar2;
                }
                true_sel->sel_vector[iVar3] = sVar7;
                iVar3 = iVar3 + uVar4;
                uVar9 = uVar9 + 1;
                pfVar5 = pfVar5 + 1;
                uVar4 = uVar6;
              } while ((uVar10 - uVar6) + uVar9 != 0);
            }
          }
        }
        uVar8 = uVar8 + 1;
        uVar10 = uVar4;
      } while (uVar8 != count + 0x3f >> 6);
    }
  }
  else {
    iVar3 = SelectFlatLoop<float,float,duckdb::Equals,true,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar3;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}